

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

DictionaryTypeHandler * __thiscall
Js::SimpleTypeHandler<3UL>::ConvertToDictionaryType
          (SimpleTypeHandler<3UL> *this,DynamicObject *instance)

{
  DictionaryTypeHandlerBase<unsigned_short> *pDVar1;
  ScriptContext *pSVar2;
  DictionaryTypeHandler *newTypeHandler;
  DynamicObject *instance_local;
  SimpleTypeHandler<3UL> *this_local;
  
  pDVar1 = SimpleTypeHandler<3ul>::
           ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>
                     ((SimpleTypeHandler<3ul> *)this,instance);
  pSVar2 = RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  pSVar2->convertSimpleToDictionaryCount = pSVar2->convertSimpleToDictionaryCount + 1;
  return pDVar1;
}

Assistant:

DictionaryTypeHandler* SimpleTypeHandler<size>::ConvertToDictionaryType(DynamicObject* instance)
    {
        DictionaryTypeHandler* newTypeHandler = ConvertToTypeHandler<DictionaryTypeHandler>(instance);

#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertSimpleToDictionaryCount++;
#endif
        return newTypeHandler;
    }